

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Scale_x86::forward_inplace
          (Scale_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  Mat *this_00;
  void *pvVar6;
  long lVar7;
  _func_int **pp_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  float *pfVar22;
  ulong uVar23;
  float *pfVar24;
  float *scale_ptr;
  Mat local_78;
  
  this_00 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar16 = this_00->dims;
  if (this_00->elempack == 4) {
    if (iVar16 == 3) {
      uVar20 = this_00->h * this_00->w;
      uVar5 = this_00->c;
      if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86[-3]) == 0) {
        uVar23 = 0;
        uVar19 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar19 = uVar23;
        }
        uVar21 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar21 = uVar23;
        }
        for (; uVar23 != uVar21; uVar23 = uVar23 + 1) {
          Mat::channel(&local_78,this_00,(int)uVar23);
          pfVar24 = (float *)local_78.data;
          Mat::~Mat(&local_78);
          pfVar22 = (float *)((long)this_00[1].data + uVar23 * 0x10);
          fVar3 = *pfVar22;
          fVar4 = pfVar22[1];
          fVar9 = pfVar22[2];
          fVar10 = pfVar22[3];
          uVar18 = uVar19;
          while (iVar16 = (int)uVar18, uVar18 = (ulong)(iVar16 - 1), iVar16 != 0) {
            *pfVar24 = *pfVar24 * fVar3;
            pfVar24[1] = pfVar24[1] * fVar4;
            pfVar24[2] = pfVar24[2] * fVar9;
            pfVar24[3] = pfVar24[3] * fVar10;
            pfVar24 = pfVar24 + 4;
          }
        }
      }
      else {
        uVar23 = 0;
        uVar19 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar19 = uVar23;
        }
        uVar21 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar21 = uVar23;
        }
        for (; uVar23 != uVar21; uVar23 = uVar23 + 1) {
          Mat::channel(&local_78,this_00,(int)uVar23);
          pfVar24 = (float *)local_78.data;
          Mat::~Mat(&local_78);
          pfVar22 = (float *)((long)this_00[1].data + uVar23 * 0x10);
          fVar3 = *pfVar22;
          fVar4 = pfVar22[1];
          fVar9 = pfVar22[2];
          fVar10 = pfVar22[3];
          pfVar22 = (float *)(*(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86[-3]) +
                             uVar23 * 0x10);
          fVar11 = *pfVar22;
          fVar12 = pfVar22[1];
          fVar13 = pfVar22[2];
          fVar14 = pfVar22[3];
          uVar18 = uVar19;
          while (iVar16 = (int)uVar18, uVar18 = (ulong)(iVar16 - 1), iVar16 != 0) {
            *pfVar24 = *pfVar24 * fVar3 + fVar11;
            pfVar24[1] = pfVar24[1] * fVar4 + fVar12;
            pfVar24[2] = pfVar24[2] * fVar9 + fVar13;
            pfVar24[3] = pfVar24[3] * fVar10 + fVar14;
            pfVar24 = pfVar24 + 4;
          }
        }
      }
    }
    else if (iVar16 == 2) {
      pp_Var8 = this->_vptr_Scale_x86;
      uVar5 = this_00->w;
      uVar20 = this_00->h;
      if (*(int *)(&this->field_0xd4 + (long)pp_Var8[-3]) == 0) {
        uVar23 = 0;
        uVar19 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar19 = uVar23;
        }
        uVar21 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar21 = uVar23;
        }
        for (; uVar23 != uVar21; uVar23 = uVar23 + 1) {
          pfVar24 = (float *)((long)this_00->w * uVar23 * this_00->elemsize + (long)this_00->data);
          pfVar22 = (float *)((long)this_00[1].data + uVar23 * 0x10);
          fVar3 = *pfVar22;
          fVar4 = pfVar22[1];
          fVar9 = pfVar22[2];
          fVar10 = pfVar22[3];
          uVar18 = uVar19;
          while (iVar16 = (int)uVar18, uVar18 = (ulong)(iVar16 - 1), iVar16 != 0) {
            *pfVar24 = *pfVar24 * fVar3;
            pfVar24[1] = pfVar24[1] * fVar4;
            pfVar24[2] = pfVar24[2] * fVar9;
            pfVar24[3] = pfVar24[3] * fVar10;
            pfVar24 = pfVar24 + 4;
          }
        }
      }
      else {
        uVar23 = 0;
        uVar19 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar19 = uVar23;
        }
        uVar21 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar21 = uVar23;
        }
        for (; uVar23 != uVar21; uVar23 = uVar23 + 1) {
          pfVar24 = (float *)((long)this_00->w * uVar23 * this_00->elemsize + (long)this_00->data);
          pfVar22 = (float *)((long)this_00[1].data + uVar23 * 0x10);
          fVar3 = *pfVar22;
          fVar4 = pfVar22[1];
          fVar9 = pfVar22[2];
          fVar10 = pfVar22[3];
          pfVar22 = (float *)(*(long *)(&this->field_0x120 + (long)pp_Var8[-3]) + uVar23 * 0x10);
          fVar11 = *pfVar22;
          fVar12 = pfVar22[1];
          fVar13 = pfVar22[2];
          fVar14 = pfVar22[3];
          uVar18 = uVar19;
          while (iVar16 = (int)uVar18, uVar18 = (ulong)(iVar16 - 1), iVar16 != 0) {
            *pfVar24 = *pfVar24 * fVar3 + fVar11;
            pfVar24[1] = pfVar24[1] * fVar4 + fVar12;
            pfVar24[2] = pfVar24[2] * fVar9 + fVar13;
            pfVar24[3] = pfVar24[3] * fVar10 + fVar14;
            pfVar24 = pfVar24 + 4;
          }
        }
      }
    }
    else if (iVar16 == 1) {
      uVar5 = this_00->w;
      pvVar6 = this_00[1].data;
      if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86[-3]) == 0) {
        uVar23 = 0;
        uVar19 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar19 = uVar23;
        }
        for (; uVar19 * 0x10 != uVar23; uVar23 = uVar23 + 0x10) {
          pfVar22 = (float *)((long)this_00->data + uVar23);
          fVar3 = pfVar22[1];
          fVar4 = pfVar22[2];
          fVar9 = pfVar22[3];
          pfVar24 = (float *)((long)pvVar6 + uVar23);
          fVar10 = pfVar24[1];
          fVar11 = pfVar24[2];
          fVar12 = pfVar24[3];
          pfVar1 = (float *)((long)this_00->data + uVar23);
          *pfVar1 = *pfVar24 * *pfVar22;
          pfVar1[1] = fVar10 * fVar3;
          pfVar1[2] = fVar11 * fVar4;
          pfVar1[3] = fVar12 * fVar9;
        }
      }
      else {
        lVar7 = *(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86[-3]);
        uVar23 = 0;
        uVar19 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar19 = uVar23;
        }
        for (; uVar19 * 0x10 != uVar23; uVar23 = uVar23 + 0x10) {
          pfVar22 = (float *)((long)this_00->data + uVar23);
          fVar3 = pfVar22[1];
          fVar4 = pfVar22[2];
          fVar9 = pfVar22[3];
          pfVar24 = (float *)((long)pvVar6 + uVar23);
          fVar10 = pfVar24[1];
          fVar11 = pfVar24[2];
          fVar12 = pfVar24[3];
          pfVar1 = (float *)(lVar7 + uVar23);
          fVar13 = pfVar1[1];
          fVar14 = pfVar1[2];
          fVar15 = pfVar1[3];
          pfVar2 = (float *)((long)this_00->data + uVar23);
          *pfVar2 = *pfVar1 + *pfVar24 * *pfVar22;
          pfVar2[1] = fVar13 + fVar10 * fVar3;
          pfVar2[2] = fVar14 + fVar11 * fVar4;
          pfVar2[3] = fVar15 + fVar12 * fVar9;
        }
      }
    }
  }
  else {
    if (iVar16 != 3) {
      iVar16 = Scale::forward_inplace
                         ((Scale *)((long)&this->_vptr_Scale_x86 + (long)this->_vptr_Scale_x86[-3]),
                          bottom_top_blobs,opt);
      return iVar16;
    }
    uVar5 = this_00->c;
    iVar16 = this_00->h * this_00->w;
    pvVar6 = this_00[1].data;
    if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86[-3]) == 0) {
      uVar23 = 0;
      uVar19 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar19 = uVar23;
      }
      for (; uVar23 != uVar19; uVar23 = uVar23 + 1) {
        Mat::channel(&local_78,this_00,(int)uVar23);
        pfVar22 = (float *)local_78.data;
        Mat::~Mat(&local_78);
        fVar3 = *(float *)((long)pvVar6 + uVar23 * 4);
        for (iVar17 = iVar16; 0 < iVar17; iVar17 = iVar17 + -1) {
          *pfVar22 = *pfVar22 * fVar3;
          pfVar22 = pfVar22 + 1;
        }
      }
    }
    else {
      lVar7 = *(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86[-3]);
      uVar23 = 0;
      uVar19 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar19 = uVar23;
      }
      for (; uVar23 != uVar19; uVar23 = uVar23 + 1) {
        Mat::channel(&local_78,this_00,(int)uVar23);
        pfVar22 = (float *)local_78.data;
        Mat::~Mat(&local_78);
        fVar3 = *(float *)((long)pvVar6 + uVar23 * 4);
        fVar4 = *(float *)(lVar7 + uVar23 * 4);
        for (iVar17 = iVar16; 0 < iVar17; iVar17 = iVar17 + -1) {
          *pfVar22 = *pfVar22 * fVar3 + fVar4;
          pfVar22 = pfVar22 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale_x86::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    __m256 _bias = _mm256_loadu_ps(bias + i * 8);
                    _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    _p = _mm256_mul_ps(_p, _s);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    __m128 _bias = _mm_loadu_ps(bias + i * 4);
                    _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                    _mm_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    _p = _mm_mul_ps(_p, _s);
                    _mm_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return Scale::forward_inplace(bottom_top_blobs, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (bias_term)
    {
        const float* scale_ptr = scale_blob;
        const float* bias_ptr = bias_data;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];
            float bias = bias_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            __m256 _bias = _mm256_set1_ps(bias);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr = *ptr * s + bias;

                ptr++;
            }
        }
    }
    else
    {
        const float* scale_ptr = scale_blob;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _s);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr *= s;

                ptr++;
            }
        }
    }

    return 0;
}